

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  byte in_DL;
  long in_RSI;
  Status *in_RDI;
  WritableFile *lfile;
  uint64_t new_log_number;
  bool allow_delay;
  Status *s;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  DBImpl *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  CondVar *in_stack_ffffffffffffff80;
  Writer *this_00;
  MemTable *this_01;
  string local_50 [32];
  undefined1 local_30 [8];
  undefined8 local_28;
  uint64_t local_20;
  undefined1 local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  port::Mutex::AssertHeld((Mutex *)(in_RSI + 0x8c8));
  local_12 = (local_11 ^ 0xff) & 1;
  local_13 = 0;
  Status::Status(in_RDI);
  while( true ) {
    while( true ) {
      bVar1 = Status::ok((Status *)(in_RSI + 0xa28));
      if (!bVar1) {
        Status::operator=((Status *)in_stack_ffffffffffffff80,(Status *)in_stack_ffffffffffffff78);
        return (Status)(char *)in_RDI;
      }
      if (((local_12 & 1) == 0) ||
         (iVar2 = VersionSet::NumLevelFiles
                            ((VersionSet *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c),
         iVar2 < 0x10)) break;
      port::Mutex::Unlock((Mutex *)0x1136f1);
      (**(code **)(**(long **)(in_RSI + 8) + 0xa0))(*(long **)(in_RSI + 8),1000);
      local_12 = 0;
      port::Mutex::Lock((Mutex *)0x113721);
    }
    if (((local_11 & 1) == 0) &&
       (sVar3 = MemTable::ApproximateMemoryUsage((MemTable *)0x113741),
       sVar3 <= *(ulong *)(in_RSI + 0x50))) break;
    if (*(long *)(in_RSI + 0x938) == 0) {
      iVar2 = VersionSet::NumLevelFiles
                        ((VersionSet *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      if (iVar2 < 0x40) {
        local_20 = VersionSet::NewFileNumber(*(VersionSet **)(in_RSI + 0xa20));
        local_28 = 0;
        this_01 = *(MemTable **)(in_RSI + 8);
        LogFileName(in_stack_ffffffffffffff78,(uint64_t)in_stack_ffffffffffffff70);
        (*(this_01->comparator_).comparator.super_Comparator._vptr_Comparator[4])
                  (local_30,this_01,local_50,&local_28);
        Status::operator=((Status *)in_stack_ffffffffffffff70,
                          (Status *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        Status::~Status((Status *)in_stack_ffffffffffffff70);
        std::__cxx11::string::~string(local_50);
        bVar1 = Status::ok(in_RDI);
        if (!bVar1) {
          VersionSet::ReuseFileNumber(*(VersionSet **)(in_RSI + 0xa20),local_20);
          return (Status)(char *)in_RDI;
        }
        this_00 = *(Writer **)(in_RSI + 0x958);
        if (this_00 != (Writer *)0x0) {
          log::Writer::~Writer(this_00);
          operator_delete(this_00,0x20);
        }
        in_stack_ffffffffffffff80 = *(CondVar **)(in_RSI + 0x948);
        if (in_stack_ffffffffffffff80 != (CondVar *)0x0) {
          (**(code **)(*(char **)in_stack_ffffffffffffff80 + 8))();
        }
        *(undefined8 *)(in_RSI + 0x948) = local_28;
        *(uint64_t *)(in_RSI + 0x950) = local_20;
        in_stack_ffffffffffffff70 = (DBImpl *)operator_new(0x20);
        log::Writer::Writer((Writer *)in_stack_ffffffffffffff70,
                            (WritableFile *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *(DBImpl **)(in_RSI + 0x958) = in_stack_ffffffffffffff70;
        *(undefined8 *)(in_RSI + 0x938) = *(undefined8 *)(in_RSI + 0x930);
        std::atomic<bool>::store
                  ((atomic<bool> *)in_stack_ffffffffffffff78,
                   SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0),
                   (memory_order)in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff78 = (string *)operator_new(0x70);
        MemTable::MemTable(this_01,(InternalKeyComparator *)this_00);
        *(string **)(in_RSI + 0x930) = in_stack_ffffffffffffff78;
        MemTable::Ref(*(MemTable **)(in_RSI + 0x930));
        local_11 = 0;
        MaybeScheduleCompaction(in_stack_ffffffffffffff70);
      }
      else {
        Log(*(Logger **)(in_RSI + 0x48),"Too many L0 files; waiting...\n");
        port::CondVar::Wait(in_stack_ffffffffffffff80);
      }
    }
    else {
      Log(*(Logger **)(in_RSI + 0x48),"Current memtable full; waiting...\n");
      port::CondVar::Wait(in_stack_ffffffffffffff80);
    }
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}